

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O1

void __thiscall n_pca::NPca::saveData(NPca *this)

{
  double *pdVar1;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ofstream file;
  long local_268 [2];
  long local_258;
  MatrixXd *local_250;
  long local_248;
  undefined8 local_240;
  undefined8 local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  puts("start save...");
  if ((this->n_config_->save_data_path_)._M_string_length == 0) {
    puts("couldn\'t find save path!");
    return;
  }
  std::ofstream::ofstream(&local_230,(this->n_config_->save_data_path_)._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    puts("open file failed!");
  }
  else {
    std::ios::clear((int)&local_230 + (int)*(undefined8 *)(local_230 + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"dimension: ",0xb);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&local_230,this->n_config_->dimension_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"image_width: ",0xd);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&local_230,this->n_config_->image_width_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"image_height: ",0xe);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&local_230,this->n_config_->image_height_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"train_mean: ",0xc);
    poVar4 = Eigen::operator<<((ostream *)&local_230,
                               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               &this->train_mean_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"train_label: ",0xd);
    piVar5 = (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar5) {
      uVar6 = 0;
      do {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,piVar5[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        uVar6 = uVar6 + 1;
        piVar5 = (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->train_label_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
    }
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"train_data_matrix: ",0x13);
    if (0 < (this->train_data_matrix_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        pdVar1 = (this->train_data_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        local_258 = (this->train_data_matrix_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols;
        local_268[0] = (long)pdVar1 + lVar7;
        if (local_258 < 0 && pdVar1 != (double *)0x0) goto LAB_0010529b;
        local_240 = 0;
        local_238 = 1;
        local_250 = &this->train_data_matrix_;
        local_248 = lVar8;
        poVar4 = Eigen::operator<<((ostream *)&local_230,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                    *)local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 8;
      } while (lVar8 < (this->train_data_matrix_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows);
    }
    std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"basic_matrix:",0xd);
    if (0 < (this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        pdVar1 = (this->basic_matrix_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        local_258 = (this->basic_matrix_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols;
        local_268[0] = (long)pdVar1 + lVar7;
        if (local_258 < 0 && pdVar1 != (double *)0x0) {
LAB_0010529b:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        local_240 = 0;
        local_238 = 1;
        local_250 = &this->basic_matrix_;
        local_248 = lVar8;
        poVar4 = Eigen::operator<<((ostream *)&local_230,
                                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                    *)local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 8;
      } while (lVar8 < (this->basic_matrix_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows);
    }
    std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::ofstream::close();
    printf("save data to %s\n",(this->n_config_->save_data_path_)._M_dataplus._M_p);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___gmon_start__;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void NPca::saveData()
{
    printf("start save...\n");
    if (n_config_->save_data_path_.size() < 1)
    {
        printf("couldn't find save path!\n");
        return;
    }

    ofstream file(n_config_->save_data_path_.c_str());
    
    if (!file.is_open())
    {
        printf("open file failed!\n");
        return;
    }

    file.clear();
    file<<"dimension: "<<n_config_->dimension_<<endl;
    file<<"image_width: "<<n_config_->image_width_<<endl;
    file<<"image_height: "<<n_config_->image_height_<<endl;
    file<<"train_mean: "<<train_mean_<<endl;

    file<<"train_label: ";
    for (int i = 0; i < train_label_.size(); i++)
        file<<train_label_[i]<<" ";
    file<<endl;
    
    file<<"train_data_matrix: ";
    for (int i = 0; i < train_data_matrix_.rows(); i++)
        file<<train_data_matrix_.row(i)<<",";
    file<<endl;

    file<<"basic_matrix:";
    for (int i = 0; i < basic_matrix_.rows(); i++)
        file<<basic_matrix_.row(i)<<",";
    file<<endl;

    file.close();

    printf("save data to %s\n", n_config_->save_data_path_.c_str());
}